

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

char * build_pathname(archive_string *as,file_info *file,int depth)

{
  char *pcVar1;
  int depth_local;
  file_info *file_local;
  archive_string *as_local;
  
  if (depth < 0x3e9) {
    if ((file->parent != (file_info *)0x0) && ((file->parent->name).length != 0)) {
      pcVar1 = build_pathname(as,file->parent,depth + 1);
      if (pcVar1 == (char *)0x0) {
        return (char *)0x0;
      }
      archive_strcat(as,"/");
    }
    if ((file->name).length == 0) {
      archive_strcat(as,".");
    }
    else {
      archive_string_concat(as,&file->name);
    }
    as_local = (archive_string *)as->s;
  }
  else {
    as_local = (archive_string *)0x0;
  }
  return (char *)as_local;
}

Assistant:

static const char *
build_pathname(struct archive_string *as, struct file_info *file, int depth)
{
	// Plain ISO9660 only allows 8 dir levels; if we get
	// to 1000, then something is very, very wrong.
	if (depth > 1000) {
		return NULL;
	}
	if (file->parent != NULL && archive_strlen(&file->parent->name) > 0) {
		if (build_pathname(as, file->parent, depth + 1) == NULL) {
			return NULL;
		}
		archive_strcat(as, "/");
	}
	if (archive_strlen(&file->name) == 0)
		archive_strcat(as, ".");
	else
		archive_string_concat(as, &file->name);
	return (as->s);
}